

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::internal::format_decimal<unsigned_long,char,fmt::internal::ThousandsSep>
               (char *buffer,unsigned_long value,uint num_digits,ThousandsSep thousands_sep)

{
  char **buffer_00;
  uint in_EDX;
  long lVar1;
  char **ppcVar2;
  ulong in_RSI;
  long in_RDI;
  ThousandsSep *unaff_retaddr;
  uint index;
  uint index_1;
  ulong local_10;
  
  buffer_00 = (char **)(in_RDI + (ulong)in_EDX);
  local_10 = in_RSI;
  while (99 < local_10) {
    lVar1 = (local_10 % 100) * 2;
    local_10 = local_10 / 100;
    ppcVar2 = (char **)((long)buffer_00 + -1);
    *(char *)((long)buffer_00 + -1) =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [(int)lVar1 + 1];
    ThousandsSep::operator()(unaff_retaddr,ppcVar2);
    buffer_00 = (char **)((long)ppcVar2 + -1);
    *(char *)((long)ppcVar2 + -1) =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [lVar1];
    ThousandsSep::operator()(unaff_retaddr,buffer_00);
  }
  if (local_10 < 10) {
    *(char *)((long)buffer_00 + -1) = (char)local_10 + '0';
  }
  else {
    ppcVar2 = (char **)((long)buffer_00 + -1);
    *(char *)((long)buffer_00 + -1) =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [(int)(local_10 << 1) + 1];
    ThousandsSep::operator()(unaff_retaddr,ppcVar2);
    *(char *)((long)ppcVar2 + -1) =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [local_10 << 1 & 0xffffffff];
  }
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits,
                           ThousandsSep thousands_sep) {
  buffer += num_digits;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = Data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = Data::DIGITS[index];
}